

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRFunction * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::allocate<spirv_cross::SPIRFunction&>
          (ObjectPool<spirv_cross::SPIRFunction> *this,SPIRFunction *p)

{
  Vector<spirv_cross::SPIRFunction_*> *this_00;
  bool bVar1;
  _Tuple_impl<0UL,_spirv_cross::SPIRFunction_*,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>
  _Var2;
  size_t sVar3;
  _Head_base<0UL,_spirv_cross::SPIRFunction_*,_false> _Var4;
  ulong count;
  SPIRFunction *pSVar5;
  
  this_00 = &this->vacants;
  sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size;
  if (sVar3 == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var2.super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>)malloc(count * 800);
    if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>._M_head_impl ==
        (SPIRFunction *)0x0) {
      return (SPIRFunction *)0x0;
    }
    SmallVector<spirv_cross::SPIRFunction_*,_0UL>::reserve(this_00,count);
    if (count != 0) {
      sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size;
      _Var4._M_head_impl =
           (SPIRFunction *)
           _Var2.super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRFunction_*,_0UL>::reserve(this_00,sVar3 + 1);
        sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.ptr[sVar3] =
             _Var4._M_head_impl;
        sVar3 = sVar3 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size = sVar3;
        _Var4._M_head_impl = _Var4._M_head_impl + 1;
        count = count - 1;
      } while (count != 0);
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,
              (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
              .buffer_size + 1);
    sVar3 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
    .ptr[sVar3]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRFunction_*,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false> =
         _Var2.super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
    .buffer_size = sVar3 + 1;
    sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size;
    pSVar5 = (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.ptr[sVar3 - 1];
    if (sVar3 == 0) goto LAB_002d55f8;
  }
  else {
    pSVar5 = (this_00->super_VectorView<spirv_cross::SPIRFunction_*>).ptr[sVar3 - 1];
  }
  SmallVector<spirv_cross::SPIRFunction_*,_0UL>::resize(this_00,sVar3 - 1);
LAB_002d55f8:
  (pSVar5->super_IVariant).self.id = (p->super_IVariant).self.id;
  (pSVar5->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRFunction_003a46d8;
  *(undefined8 *)&(pSVar5->super_IVariant).field_0xc = *(undefined8 *)&(p->super_IVariant).field_0xc
  ;
  (pSVar5->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size = 0;
  (pSVar5->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr =
       (Parameter *)&(pSVar5->arguments).stack_storage;
  (pSVar5->arguments).buffer_capacity = 8;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::operator=
            (&pSVar5->arguments,&p->arguments);
  (pSVar5->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size = 0;
  (pSVar5->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr =
       (Parameter *)&(pSVar5->shadow_arguments).stack_storage;
  (pSVar5->shadow_arguments).buffer_capacity = 8;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::operator=
            (&pSVar5->shadow_arguments,&p->shadow_arguments);
  (pSVar5->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
  buffer_size = 0;
  (pSVar5->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr =
       (TypedID<(spirv_cross::Types)2> *)&(pSVar5->local_variables).stack_storage;
  (pSVar5->local_variables).buffer_capacity = 8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::operator=
            (&pSVar5->local_variables,&p->local_variables);
  (pSVar5->entry_block).id = (p->entry_block).id;
  (pSVar5->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.buffer_size = 0;
  (pSVar5->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.ptr =
       (TypedID<(spirv_cross::Types)6> *)&(pSVar5->blocks).stack_storage;
  (pSVar5->blocks).buffer_capacity = 8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)6>,_8UL>::operator=
            (&pSVar5->blocks,&p->blocks);
  (pSVar5->combined_parameters).
  super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.buffer_size = 0;
  (pSVar5->combined_parameters).
  super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.ptr =
       (CombinedImageSamplerParameter *)&(pSVar5->combined_parameters).stack_storage;
  (pSVar5->combined_parameters).buffer_capacity = 8;
  SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL>::operator=
            (&pSVar5->combined_parameters,&p->combined_parameters);
  pSVar5->entry_line = p->entry_line;
  (pSVar5->fixup_hooks_out).buffer_capacity = 0;
  (pSVar5->fixup_hooks_out).super_VectorView<std::function<void_()>_>.ptr = (function<void_()> *)0x0
  ;
  (pSVar5->fixup_hooks_out).super_VectorView<std::function<void_()>_>.buffer_size = 0;
  SmallVector<std::function<void_()>,_0UL>::operator=(&pSVar5->fixup_hooks_out,&p->fixup_hooks_out);
  (pSVar5->fixup_hooks_in).super_VectorView<std::function<void_()>_>.ptr = (function<void_()> *)0x0;
  (pSVar5->fixup_hooks_in).super_VectorView<std::function<void_()>_>.buffer_size = 0;
  (pSVar5->fixup_hooks_in).buffer_capacity = 0;
  SmallVector<std::function<void_()>,_0UL>::operator=(&pSVar5->fixup_hooks_in,&p->fixup_hooks_in);
  (pSVar5->constant_arrays_needed_on_stack).
  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size = 0;
  (pSVar5->constant_arrays_needed_on_stack).
  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
       (TypedID<(spirv_cross::Types)0> *)&(pSVar5->constant_arrays_needed_on_stack).stack_storage;
  (pSVar5->constant_arrays_needed_on_stack).buffer_capacity = 8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
            (&pSVar5->constant_arrays_needed_on_stack,&p->constant_arrays_needed_on_stack);
  bVar1 = p->flush_undeclared;
  pSVar5->active = p->active;
  pSVar5->flush_undeclared = bVar1;
  pSVar5->do_combined_parameters = p->do_combined_parameters;
  return pSVar5;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}